

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetSOName(string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ImportInfo *pIVar2;
  long lVar3;
  string *psVar4;
  Names local_d0;
  
  if (this->Target->IsImportedTarget == true) {
    pIVar2 = GetImportInfo(this,config);
    if (pIVar2 == (ImportInfo *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_d0);
    }
    else if (pIVar2->NoSOName == true) {
      cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&pIVar2->Location);
    }
    else {
      psVar4 = &pIVar2->SOName;
      lVar3 = std::__cxx11::string::find((char *)psVar4,0x3d88cc);
      if (lVar3 == 0) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar4);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar4);
      }
    }
  }
  else {
    GetLibraryNames(&local_d0,this,config);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    paVar1 = &local_d0.SharedObject.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.SharedObject._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_d0.SharedObject.field_2._M_allocated_capacity._1_7_,
                    local_d0.SharedObject.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
           local_d0.SharedObject.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_d0.SharedObject._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_d0.SharedObject.field_2._M_allocated_capacity._1_7_,
                    local_d0.SharedObject.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_d0.SharedObject._M_string_length;
    local_d0.SharedObject._M_string_length = 0;
    local_d0.SharedObject.field_2._M_local_buf[0] = '\0';
    local_d0.SharedObject._M_dataplus._M_p = (pointer)paVar1;
    Names::~Names(&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSOName(const std::string& config) const
{
  if (this->IsImported()) {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (info->NoSOName) {
        // The imported library has no builtin soname so the name
        // searched at runtime will be just the filename.
        return cmSystemTools::GetFilenameName(info->Location);
      }
      // Use the soname given if any.
      if (info->SOName.find("@rpath/") == 0) {
        return info->SOName.substr(6);
      }
      return info->SOName;
    }
    return "";
  }
  // Compute the soname that will be built.
  return this->GetLibraryNames(config).SharedObject;
}